

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O3

HRESULT ExecuteTest(char *fileName)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  JsErrorCode JVar4;
  uint uVar5;
  HRESULT HVar6;
  size_t sVar7;
  PAL_FILE *pPVar8;
  LPCWSTR pWVar9;
  Debugger *this;
  char *pcVar10;
  char16_t *pcVar11;
  uint *fileLength;
  HostConfigFlags *pHVar12;
  uint *puVar13;
  JsContextRef local_158;
  char fullPath [260];
  uint local_4c;
  LPCSTR pCStack_48;
  uint rcount;
  LPCSTR fileContents;
  JsRuntimeHandle pvStack_38;
  UINT lengthBytes;
  JsRuntimeHandle runtime;
  
  pCStack_48 = (LPCSTR)0x0;
  pvStack_38 = (JsRuntimeHandle)0x0;
  fileContents._4_4_ = 0;
  sVar7 = strlen(fileName);
  if ((0xd < sVar7) && (iVar2 = strcmp(fileName + (sVar7 - 0xe),"ttdSentinal.js"), iVar2 == 0)) {
    if (doTTReplay == 0) {
      PAL_wprintf(L"Sentinel js file is only ok when in TTReplay mode!!!\n");
      return -0x7fffbffb;
    }
    jsrtAttributes = jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures;
    uVar5 = 0;
    JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateReplayRuntime)
                      (jsrtAttributes,ttUri,ttUriLength,false,Helpers::TTCreateStreamCallback,
                       Helpers::TTReadBytesFromStreamCallback,Helpers::TTFlushAndCloseStreamCallback
                       ,(JsThreadServiceCallback)0x0,&stack0xffffffffffffffc8);
    if (JVar4 == JsNoError) {
      chRuntime = pvStack_38;
      local_158 = (JsContextRef)0x0;
      JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateContext)(pvStack_38,true,&local_158);
      if (JVar4 == JsNoError) {
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
        if (JVar4 == JsNoError) {
          uVar5 = RunScript(fileName,pCStack_48,(ulong)fileContents._4_4_,WScriptJsrt::FinalizeFree,
                            (JsValueRef)0x0,(char *)0x0,(JsValueRef)0x0);
          if ((int)uVar5 < 0) goto LAB_00109594;
          local_4c = 0;
          JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)((JsContextRef)0x0);
          if (JVar4 == JsNoError) {
            puVar13 = &local_4c;
            fileLength = puVar13;
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(local_158,puVar13);
            if (local_4c == 0) goto LAB_00109594;
            ExecuteTest();
            pHVar12 = (HostConfigFlags *)&ChakraRTInterface::m_jsApiHooks;
LAB_00109779:
            uVar5 = (uint)puVar13;
            if (*(bool *)((long)&((JsAPIHooks *)pHVar12)->pfJsrtSetRuntimeMemoryLimit + 2) == true)
            {
              CreateParserState(pCStack_48,(size_t)fileLength,WScriptJsrt::FinalizeFree,(LPCWSTR)0x0
                               );
            }
            else if (*(bool *)((long)&((JsAPIHooks *)pHVar12)->pfJsrtSetRuntimeMemoryLimit + 4) ==
                     true) {
              CreateParserStateAndRunScript
                        (fileName,pCStack_48,(ulong)fileContents._4_4_,WScriptJsrt::FinalizeFree,
                         (char *)&local_158);
            }
            else {
              uVar5 = RunScript(fileName,pCStack_48,(ulong)fileContents._4_4_,
                                WScriptJsrt::FinalizeFree,(JsValueRef)0x0,(char *)&local_158,
                                (JsValueRef)0x0);
            }
            goto LAB_00109594;
          }
          pPVar8 = PAL_get_stderr(0);
          pWVar9 = Helpers::JsErrorCodeToString(JVar4);
          pcVar11 = 
          L"ERROR: ChakraRTInterface::JsSetCurrentContext(nullptr) failed. JsErrorCode=0x%x (%s)\n";
        }
        else {
          uVar5 = 0;
          pPVar8 = PAL_get_stderr(0);
          pWVar9 = Helpers::JsErrorCodeToString(JVar4);
          pcVar11 = 
          L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n";
        }
      }
      else {
        uVar5 = 0;
        pPVar8 = PAL_get_stderr(0);
        pWVar9 = Helpers::JsErrorCodeToString(JVar4);
        pcVar11 = 
        L"ERROR: ChakraRTInterface::JsTTDCreateContext(runtime, true, &context) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      pPVar8 = PAL_get_stderr(0);
      pWVar9 = Helpers::JsErrorCodeToString(JVar4);
      pcVar11 = 
      L"ERROR: ChakraRTInterface::JsTTDCreateReplayRuntime(jsrtAttributes, ttUri, ttUriLength, Helpers::TTCreateStreamCallback, Helpers::TTReadBytesFromStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar8,pcVar11,(ulong)JVar4,pWVar9);
    pPVar8 = PAL_get_stderr(0);
    PAL_fflush(pPVar8);
    goto LAB_00109594;
  }
  pcVar10 = fileName;
  uVar3 = Helpers::LoadScriptFromFile
                    (fileName,&stack0xffffffffffffffb8,(UINT *)((long)&fileContents + 4),
                     (string *)0x0,false);
  puVar13 = (uint *)(ulong)uVar3;
  uVar5 = uVar3;
  if ((int)uVar3 < 0) goto LAB_00109594;
  pHVar12 = &HostConfigFlags::flags;
  if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled == true) {
    jsrtAttributes = jsrtAttributes | 0x8000000;
  }
  if (doTTRecord == 0) {
    if (doTTReplay != 0) {
      ExecuteTest();
      HVar6 = ExecuteTest(pcVar10);
      if (-1 < HVar6) {
        PAL__flushall();
        if ((ChakraRTInterface::m_testHooks.pfSetEnableCheckMemoryLeakOutput !=
             (SetEnableCheckMemoryLeakOutputPtr)0x0 & ChakraRTInterface::m_testHooksSetup) == 1) {
          (*ChakraRTInterface::m_testHooks.pfSetEnableCheckMemoryLeakOutput)(true);
        }
        return HVar6;
      }
      PAL_exit(0);
    }
    JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateRuntime)
                      (jsrtAttributes,(JsThreadServiceCallback)0x0,&stack0xffffffffffffffc8);
    if (JVar4 == JsNoError) {
      chRuntime = pvStack_38;
      if (HostConfigFlags::flags.DebugLaunch == true) {
        this = Debugger::GetDebugger(pvStack_38);
        Debugger::StartDebugging(this,pvStack_38);
      }
      local_158 = (JsContextRef)0x0;
      JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)(pvStack_38,&local_158);
      if (JVar4 == JsNoError) {
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
        if (JVar4 == JsNoError) {
LAB_00109636:
          if ((ChakraRTInterface::m_testHooks.pfSetCheckOpHelpersFlag != (_func_HRESULT_bool *)0x0 &
              ChakraRTInterface::m_testHooksSetup) == 1) {
            (*ChakraRTInterface::m_testHooks.pfSetCheckOpHelpersFlag)(true);
          }
          bVar1 = WScriptJsrt::Initialize();
          uVar5 = 0x80004005;
          if ((!bVar1) ||
             (fileLength = (uint *)fileName, pcVar10 = _fullpath((char *)&local_158,fileName,0x104),
             pcVar10 == (char *)0x0)) goto LAB_00109594;
          if (HostConfigFlags::flags.TrackRejectedPromises == true) {
            fileLength = (uint *)0x0;
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetHostPromiseRejectionTracker)
                      (WScriptJsrt::PromiseRejectionTrackerCallback,(void *)0x0);
          }
          if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled == true) {
            uVar5 = CreateLibraryByteCode(pCStack_48);
            goto LAB_00109594;
          }
          if (HostConfigFlags::flags.SerializedIsEnabled == true) {
            CreateAndRunSerializedScript
                      (fileName,pCStack_48,(ulong)fileContents._4_4_,WScriptJsrt::FinalizeFree,
                       (char *)&local_158);
            uVar5 = uVar3;
            goto LAB_00109594;
          }
          goto LAB_00109779;
        }
LAB_00109556:
        pPVar8 = PAL_get_stderr(0);
        pWVar9 = Helpers::JsErrorCodeToString(JVar4);
        pcVar11 = 
        L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n";
      }
      else {
        pPVar8 = PAL_get_stderr(0);
        pWVar9 = Helpers::JsErrorCodeToString(JVar4);
        pcVar11 = 
        L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      pPVar8 = PAL_get_stderr(0);
      pWVar9 = Helpers::JsErrorCodeToString(JVar4);
      pcVar11 = 
      L"ERROR: ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
  }
  else {
    jsrtAttributes = jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures;
    JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateRecordRuntime)
                      (jsrtAttributes,false,(ulong)snapInterval,(ulong)snapHistoryLength,
                       Helpers::TTCreateStreamCallback,Helpers::TTWriteBytesToStreamCallback,
                       Helpers::TTFlushAndCloseStreamCallback,(JsThreadServiceCallback)0x0,
                       &stack0xffffffffffffffc8);
    if (JVar4 == JsNoError) {
      chRuntime = pvStack_38;
      local_158 = (JsContextRef)0x0;
      JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateContext)(pvStack_38,true,&local_158);
      if (JVar4 == JsNoError) {
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
        if (JVar4 != JsNoError) goto LAB_00109556;
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetObjectBeforeCollectCallback)
                          (local_158,(void *)0x0,WScriptJsrt::JsContextBeforeCollectCallback);
        if (JVar4 == JsNoError) goto LAB_00109636;
        pPVar8 = PAL_get_stderr(0);
        pWVar9 = Helpers::JsErrorCodeToString(JVar4);
        pcVar11 = 
        L"ERROR: ChakraRTInterface::JsSetObjectBeforeCollectCallback(context, nullptr, WScriptJsrt::JsContextBeforeCollectCallback) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
      else {
        pPVar8 = PAL_get_stderr(0);
        pWVar9 = Helpers::JsErrorCodeToString(JVar4);
        pcVar11 = 
        L"ERROR: ChakraRTInterface::JsTTDCreateContext(runtime, true, &context) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      pPVar8 = PAL_get_stderr(0);
      pWVar9 = Helpers::JsErrorCodeToString(JVar4);
      pcVar11 = 
      L"ERROR: ChakraRTInterface::JsTTDCreateRecordRuntime(jsrtAttributes, snapInterval, snapHistoryLength, Helpers::TTCreateStreamCallback, Helpers::TTWriteBytesToStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
  }
  PAL_fwprintf(pPVar8,pcVar11,(ulong)JVar4,pWVar9);
  pPVar8 = PAL_get_stderr(0);
  PAL_fflush(pPVar8);
LAB_00109594:
  if (Debugger::debugger != (Debugger *)0x0) {
    Debugger::CompareOrWriteBaselineFile(Debugger::debugger,fileName);
    Debugger::CloseDebugger();
  }
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)((JsContextRef)0x0);
  if (pvStack_38 != (JsRuntimeHandle)0x0) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtDisposeRuntime)(pvStack_38);
  }
  PAL__flushall();
  return uVar5;
}

Assistant:

HRESULT ExecuteTest(const char* fileName)
{
    HRESULT hr = S_OK;
    LPCSTR fileContents = nullptr;
    JsRuntimeHandle runtime = JS_INVALID_RUNTIME_HANDLE;
    UINT lengthBytes = 0;

    if(strlen(fileName) >= 14 && strcmp(fileName + strlen(fileName) - 14, "ttdSentinal.js") == 0)
    {
#if !ENABLE_TTD
        wprintf(_u("Sentinel js file is only ok when in TTDebug mode!!!\n"));
        return E_FAIL;
#else
        if(!doTTReplay)
        {
            wprintf(_u("Sentinel js file is only ok when in TTReplay mode!!!\n"));
            return E_FAIL;
        }

        jsrtAttributes = static_cast<JsRuntimeAttributes>(jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures);

        IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateReplayRuntime(jsrtAttributes, ttUri, ttUriLength, Helpers::TTCreateStreamCallback, Helpers::TTReadBytesFromStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime));
        chRuntime = runtime;

        JsContextRef context = JS_INVALID_REFERENCE;
        IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateContext(runtime, true, &context));
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));

        IfFailGo(RunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr, nullptr, nullptr));

        unsigned int rcount = 0;
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(nullptr));
        ChakraRTInterface::JsRelease(context, &rcount);
        AssertMsg(rcount == 0, "Should only have had 1 ref from replay code and one ref from current context??");
#endif
    }
    else
    {
        LPCOLESTR contentsRaw = nullptr;

        char fullPath[_MAX_PATH];
        size_t len = 0;

        hr = Helpers::LoadScriptFromFile(fileName, fileContents, &lengthBytes);
        contentsRaw; lengthBytes; // Unused for now.

        IfFailGo(hr);
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled)
        {
            jsrtAttributes = (JsRuntimeAttributes)(jsrtAttributes | JsRuntimeAttributeSerializeLibraryByteCode);
        }

#if ENABLE_TTD
        if (doTTRecord)
        {
            //Ensure we run with experimental features (as that is what Node does right now).
            jsrtAttributes = static_cast<JsRuntimeAttributes>(jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures);

            IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateRecordRuntime(jsrtAttributes, snapInterval, snapHistoryLength, Helpers::TTCreateStreamCallback, Helpers::TTWriteBytesToStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime));
            chRuntime = runtime;

            JsContextRef context = JS_INVALID_REFERENCE;
            IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateContext(runtime, true, &context));

            IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));

#if ENABLE_TTD
            //We need this here since this context is created in record
            IfJsErrorFailLog(ChakraRTInterface::JsSetObjectBeforeCollectCallback(context, nullptr, WScriptJsrt::JsContextBeforeCollectCallback));
#endif
        }
        else
        {
            AssertMsg(!doTTReplay, "Should be handled in the else case above!!!");

            IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime));
            chRuntime = runtime;

            if (HostConfigFlags::flags.DebugLaunch)
            {
                Debugger* debugger = Debugger::GetDebugger(runtime);
                debugger->StartDebugging(runtime);
            }

            JsContextRef context = JS_INVALID_REFERENCE;
            IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));

            //Don't need collect callback since this is always in replay

            IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));
        }
#else
        IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime));
        chRuntime = runtime;

        if (HostConfigFlags::flags.DebugLaunch)
        {
            Debugger* debugger = Debugger::GetDebugger(runtime);
            debugger->StartDebugging(runtime);
        }

        JsContextRef context = JS_INVALID_REFERENCE;
        IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));
#endif

#ifdef DEBUG
        ChakraRTInterface::SetCheckOpHelpersFlag(true);
#endif

        if (!WScriptJsrt::Initialize())
        {
            IfFailGo(E_FAIL);
        }

        if (_fullpath(fullPath, fileName, _MAX_PATH) == nullptr)
        {
            IfFailGo(E_FAIL);
        }

        if (HostConfigFlags::flags.TrackRejectedPromises)
        {
            ChakraRTInterface::JsSetHostPromiseRejectionTracker(WScriptJsrt::PromiseRejectionTrackerCallback, nullptr);
        }
        
        len = strlen(fullPath);
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled)
        {
            IfFailGo(CreateLibraryByteCode(fileContents));
        }
        else if (HostConfigFlags::flags.SerializedIsEnabled)
        {
            CreateAndRunSerializedScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, fullPath);
        }
        else if (HostConfigFlags::flags.GenerateParserStateCacheIsEnabled)
        {
            CreateParserState(fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr);
        }
        else if (HostConfigFlags::flags.UseParserStateCacheIsEnabled)
        {
            CreateParserStateAndRunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, fullPath);
        }
        else
        {
            IfFailGo(RunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr, fullPath, nullptr));
        }
    }
Error:
    if (Debugger::debugger != nullptr)
    {
        Debugger::debugger->CompareOrWriteBaselineFile(fileName);
        Debugger::CloseDebugger();
    }

    ChakraRTInterface::JsSetCurrentContext(nullptr);

    if (runtime != JS_INVALID_RUNTIME_HANDLE)
    {
        ChakraRTInterface::JsDisposeRuntime(runtime);
    }

    _flushall();

    return hr;
}